

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_PrintDiv(Fx_Man_t *p,int iDiv)

{
  int *piVar1;
  uint uVar2;
  Hsh_VecMan_t *pHVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  timespec ts;
  timespec local_40;
  
  uVar5 = (ulong)(uint)iDiv;
  printf("%4d : ",(ulong)(uint)p->nDivs);
  printf("Div %7d : ",uVar5);
  if ((iDiv < 0) || (p->vWeights->nSize <= iDiv)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
  }
  printf("Weight %12.5f  ",(double)p->vWeights->pArray[uVar5]);
  pHVar3 = p->pHash;
  if (iDiv < pHVar3->vMap->nSize) {
    iVar6 = pHVar3->vMap->pArray[uVar5];
    if ((-1 < (long)iVar6) && (iVar6 < pHVar3->vData->nSize)) {
      piVar1 = pHVar3->vData->pArray + iVar6;
      iVar6 = *piVar1;
      (pHVar3->vTemp).nCap = iVar6;
      (pHVar3->vTemp).nSize = iVar6;
      (pHVar3->vTemp).pArray = piVar1 + 2;
      if (0 < iVar6) {
        iVar7 = 0x61000000;
        lVar8 = 0;
        do {
          uVar2 = (pHVar3->vTemp).pArray[lVar8];
          if ((int)uVar2 < 0) goto LAB_0025ecf6;
          if ((uVar2 & 1) == 0) {
            putchar(iVar7 >> 0x18);
            iVar6 = (pHVar3->vTemp).nSize;
          }
          lVar8 = lVar8 + 1;
          iVar7 = iVar7 + 0x1000000;
        } while (lVar8 < iVar6);
      }
      printf(" + ");
      iVar6 = (pHVar3->vTemp).nSize;
      if (0 < iVar6) {
        iVar7 = 0x41000000;
        lVar8 = 0;
        do {
          uVar2 = (pHVar3->vTemp).pArray[lVar8];
          if ((int)uVar2 < 0) {
LAB_0025ecf6:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10d,"int Abc_LitIsCompl(int)");
          }
          if ((uVar2 & 1) != 0) {
            putchar(iVar7 >> 0x18);
            iVar6 = (pHVar3->vTemp).nSize;
          }
          lVar8 = lVar8 + 1;
          iVar7 = iVar7 + 0x1000000;
        } while (lVar8 < iVar6);
      }
      pHVar3 = p->pHash;
      if (pHVar3->vMap->nSize <= iDiv) goto LAB_0025ed53;
      iVar6 = pHVar3->vMap->pArray[uVar5];
      if ((-1 < (long)iVar6) && (iVar6 < pHVar3->vData->nSize)) {
        piVar1 = pHVar3->vData->pArray + iVar6;
        iVar6 = *piVar1;
        (pHVar3->vTemp).nCap = iVar6;
        (pHVar3->vTemp).nSize = iVar6;
        (pHVar3->vTemp).pArray = piVar1 + 2;
        if (iVar6 < 0xd) {
          iVar6 = iVar6 + -0xd;
          do {
            putchar(0x20);
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0);
        }
        printf("Lits =%7d  ",(ulong)(uint)p->nLits);
        printf("Divs =%8d  ",(ulong)(uint)p->pHash->vMap->nSize);
        iVar7 = 3;
        iVar6 = clock_gettime(3,&local_40);
        if (iVar6 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        lVar4 = p->timeStart;
        Abc_Print(iVar7,"%s =","Time");
        Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar8 - lVar4) / 1000000.0);
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_0025ed53:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void Fx_PrintDiv( Fx_Man_t * p, int iDiv )
{
    int i;
    printf( "%4d : ", p->nDivs );
    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry(p->vWeights, iDiv) );
//    printf( "Compl %4d  ", p->nCompls );
    Fx_PrintDivOne( Hsh_VecReadEntry(p->pHash, iDiv) );
    for ( i = Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) + 3; i < 16; i++ )
        printf( " " );
    printf( "Lits =%7d  ", p->nLits );
    printf( "Divs =%8d  ", Hsh_VecSize(p->pHash) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeStart );
}